

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry.c
# Opt level: O0

void cleanup_parse_ui_entry(void)

{
  wchar_t local_c;
  wchar_t i;
  
  for (local_c = L'\0'; local_c < n_entry; local_c = local_c + L'\x01') {
    string_free(entries[local_c]->name);
    mem_free(entries[local_c]->categories);
    mem_free(entries[local_c]->obj_props);
    mem_free(entries[local_c]->p_abilities);
    mem_free(entries[local_c]->label);
    mem_free(entries[local_c]);
  }
  mem_free(entries);
  n_entry = L'\0';
  nalloc_entry = L'\0';
  entries = (ui_entry **)0x0;
  for (local_c = L'\0'; local_c < n_category; local_c = local_c + L'\x01') {
    string_free(categories[local_c]);
  }
  mem_free(categories);
  n_category = L'\0';
  nalloc_category = L'\0';
  categories = (char **)0x0;
  return;
}

Assistant:

static void cleanup_parse_ui_entry(void)
{
	int i;

	for (i = 0; i < n_entry; ++i) {
		string_free(entries[i]->name);
		mem_free(entries[i]->categories);
		mem_free(entries[i]->obj_props);
		mem_free(entries[i]->p_abilities);
		mem_free(entries[i]->label);
		mem_free(entries[i]);
	}
	mem_free(entries);
	n_entry = 0;
	nalloc_entry = 0;
	entries = NULL;

	for (i = 0; i < n_category; ++i) {
		string_free(categories[i]);
	}
	mem_free(categories);
	n_category = 0;
	nalloc_category = 0;
	categories = NULL;
}